

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void buildCore(VM *vm)

{
  anon_union_8_2_14f5a2bf_for_Value_1 objModule;
  Class *pCVar1;
  Value value_00;
  Method method_00;
  Method method_01;
  Method method_02;
  Method method_03;
  Method method_04;
  Method method_05;
  Method method_06;
  Method method_07;
  Method method_08;
  Method method_09;
  Method method_9;
  int globalIdx_9;
  uint32_t length_9;
  Class *objectMetaclass;
  Method method_8;
  int globalIdx_8;
  uint32_t length_8;
  Method method_7;
  int globalIdx_7;
  uint32_t length_7;
  Method method_6;
  int globalIdx_6;
  uint32_t length_6;
  Method method_5;
  int globalIdx_5;
  uint32_t length_5;
  Method method_4;
  int globalIdx_4;
  uint32_t length_4;
  Method method_3;
  int globalIdx_3;
  uint32_t length_3;
  Method method_2;
  int globalIdx_2;
  uint32_t length_2;
  Method method_1;
  int globalIdx_1;
  uint32_t length_1;
  Method method;
  int globalIdx;
  uint32_t length;
  Value value;
  ObjModule *coreModule;
  VM *vm_local;
  
  objModule.objHeader = &newObjModule(vm,(char *)0x0)->objHeader;
  value_00.field_1.objHeader = objModule.objHeader;
  value_00._0_8_ = 5;
  mapSet(vm,vm->allModules,(Value)ZEXT816(1),value_00);
  pCVar1 = defineClass(vm,(ObjModule *)objModule.objHeader,"object");
  vm->objectClass = pCVar1;
  method.field_1._0_4_ = getIndexFromSymbolTable(&vm->allMethodNames,"!",1);
  if (method.field_1._0_4_ == -1) {
    method.field_1._0_4_ = addSymbol(vm,&vm->allMethodNames,"!",1);
  }
  method_00.field_1.primFn = primObjectNot;
  method_00._0_8_ = 1;
  bindMethod(vm,vm->objectClass,method.field_1._0_4_,method_00);
  method_1.field_1._0_4_ = getIndexFromSymbolTable(&vm->allMethodNames,"==(_)",5);
  if (method_1.field_1._0_4_ == -1) {
    method_1.field_1._0_4_ = addSymbol(vm,&vm->allMethodNames,"==(_)",5);
  }
  method_01.field_1.primFn = primObjectEqual;
  method_01._0_8_ = 1;
  bindMethod(vm,vm->objectClass,method_1.field_1._0_4_,method_01);
  method_2.field_1._0_4_ = getIndexFromSymbolTable(&vm->allMethodNames,"!=(_)",5);
  if (method_2.field_1._0_4_ == -1) {
    method_2.field_1._0_4_ = addSymbol(vm,&vm->allMethodNames,"!=(_)",5);
  }
  method_02.field_1.primFn = primObjectNotEqual;
  method_02._0_8_ = 1;
  bindMethod(vm,vm->objectClass,method_2.field_1._0_4_,method_02);
  method_3.field_1._0_4_ = getIndexFromSymbolTable(&vm->allMethodNames,"is(_)",5);
  if (method_3.field_1._0_4_ == -1) {
    method_3.field_1._0_4_ = addSymbol(vm,&vm->allMethodNames,"is(_)",5);
  }
  method_03.field_1.primFn = primObjectIs;
  method_03._0_8_ = 1;
  bindMethod(vm,vm->objectClass,method_3.field_1._0_4_,method_03);
  method_4.field_1._0_4_ = getIndexFromSymbolTable(&vm->allMethodNames,"toString",8);
  if (method_4.field_1._0_4_ == -1) {
    method_4.field_1._0_4_ = addSymbol(vm,&vm->allMethodNames,"toString",8);
  }
  method_04.field_1.primFn = primObjectToString;
  method_04._0_8_ = 1;
  bindMethod(vm,vm->objectClass,method_4.field_1._0_4_,method_04);
  method_5.field_1._0_4_ = getIndexFromSymbolTable(&vm->allMethodNames,"type",4);
  if (method_5.field_1._0_4_ == -1) {
    method_5.field_1._0_4_ = addSymbol(vm,&vm->allMethodNames,"type",4);
  }
  method_05.field_1.primFn = primObjectType;
  method_05._0_8_ = 1;
  bindMethod(vm,vm->objectClass,method_5.field_1._0_4_,method_05);
  pCVar1 = defineClass(vm,(ObjModule *)objModule.objHeader,"class");
  vm->classOfClass = pCVar1;
  bindSuperClass(vm,vm->classOfClass,vm->objectClass);
  method_6.field_1._0_4_ = getIndexFromSymbolTable(&vm->allMethodNames,"name",4);
  if (method_6.field_1._0_4_ == -1) {
    method_6.field_1._0_4_ = addSymbol(vm,&vm->allMethodNames,"name",4);
  }
  method_06.field_1.primFn = primClassName;
  method_06._0_8_ = 1;
  bindMethod(vm,vm->classOfClass,method_6.field_1._0_4_,method_06);
  method_7.field_1._0_4_ = getIndexFromSymbolTable(&vm->allMethodNames,"supertype",9);
  if (method_7.field_1._0_4_ == -1) {
    method_7.field_1._0_4_ = addSymbol(vm,&vm->allMethodNames,"supertype",9);
  }
  method_07.field_1.primFn = primClassSupertype;
  method_07._0_8_ = 1;
  bindMethod(vm,vm->classOfClass,method_7.field_1._0_4_,method_07);
  method_8.field_1._0_4_ = getIndexFromSymbolTable(&vm->allMethodNames,"toString",8);
  if (method_8.field_1._0_4_ == -1) {
    method_8.field_1._0_4_ = addSymbol(vm,&vm->allMethodNames,"toString",8);
  }
  method_08.field_1.primFn = primClassToString;
  method_08._0_8_ = 1;
  bindMethod(vm,vm->classOfClass,method_8.field_1._0_4_,method_08);
  pCVar1 = defineClass(vm,(ObjModule *)objModule.objHeader,"objectMeta");
  bindSuperClass(vm,pCVar1,vm->classOfClass);
  method_9.field_1._0_4_ = getIndexFromSymbolTable(&vm->allMethodNames,"same(_,_)",9);
  if (method_9.field_1._0_4_ == -1) {
    method_9.field_1._0_4_ = addSymbol(vm,&vm->allMethodNames,"same(_,_)",9);
  }
  method_09.field_1.primFn = primObjectmetaSame;
  method_09._0_8_ = 1;
  bindMethod(vm,pCVar1,method_9.field_1._0_4_,method_09);
  (vm->objectClass->objHeader).class = pCVar1;
  (pCVar1->objHeader).class = vm->classOfClass;
  (vm->classOfClass->objHeader).class = vm->classOfClass;
  executeModule(vm,(Value)ZEXT816(1),coreModuleCode);
  return;
}

Assistant:

void buildCore(VM *vm) {
    // 创建核心模块
    ObjModule *coreModule = newObjModule(vm, NULL);
    mapSet(vm, vm->allModules, CORE_MODULE, OBJ_TO_VALUE(coreModule));

    // 定义object类并绑定方法
    vm->objectClass = defineClass(vm, coreModule, "object");
    PRIM_METHOD_BIND(vm->objectClass, "!", primObjectNot);
    PRIM_METHOD_BIND(vm->objectClass, "==(_)", primObjectEqual);
    PRIM_METHOD_BIND(vm->objectClass, "!=(_)", primObjectNotEqual);
    PRIM_METHOD_BIND(vm->objectClass, "is(_)", primObjectIs);
    PRIM_METHOD_BIND(vm->objectClass, "toString", primObjectToString);
    PRIM_METHOD_BIND(vm->objectClass, "type", primObjectType);

    // 定义classOfClass类,它是所有meta类的meta类和基类
    vm->classOfClass = defineClass(vm, coreModule, "class");

    // objectClass是任何类的基类
    bindSuperClass(vm, vm->classOfClass, vm->objectClass);

    PRIM_METHOD_BIND(vm->classOfClass, "name", primClassName);
    PRIM_METHOD_BIND(vm->classOfClass, "supertype", primClassSupertype);
    PRIM_METHOD_BIND(vm->classOfClass, "toString", primClassToString);

    // 定义object类的元信息类objectMetaclass, 无须挂载到vm
    Class *objectMetaclass = defineClass(vm, coreModule, "objectMeta");

    // classOfClass类是所有meta类的meta类和基类
    bindSuperClass(vm, objectMetaclass, vm->classOfClass);

    // 类型比较
    PRIM_METHOD_BIND(objectMetaclass, "same(_,_)", primObjectmetaSame);

    // 绑定各自的meta类
    vm->objectClass->objHeader.class = objectMetaclass;
    objectMetaclass->objHeader.class = vm->classOfClass;
    vm->classOfClass->objHeader.class = vm->classOfClass; // 元信息类回路,meta类终点

    // 执行核心模块
    executeModule(vm, CORE_MODULE, coreModuleCode);
}